

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_traits.h
# Opt level: O2

Shape * dukglue::detail::apply_fp<Shape*,std::__cxx11::string_const&,std::__cxx11::string>
                  (_func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                   *pf,tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *tup)

{
  Shape *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)tup);
  pSVar1 = (*pf)(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return pSVar1;
}

Assistant:

Ret apply_fp(Ret(*pf)(Args...), const std::tuple<BakedArgs...>&  tup)
        {
            return apply_fp_helper(pf, typename make_indexes<BakedArgs...>::type(), std::tuple<BakedArgs...>(tup));
        }